

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

void * do_rallocx(void *ptr,size_t size,int flags,_Bool is_realloc)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  rtree_leaf_elm_t *prVar3;
  size_t oldsize;
  void **ppvVar4;
  uint64_t uVar5;
  rtree_leaf_elm_t *prVar6;
  long lVar7;
  _Bool _Var8;
  tcaches_t *ptVar9;
  uint uVar10;
  rtree_leaf_elm_t *prVar11;
  ulong uVar12;
  int *piVar13;
  void *__dest;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  tsd_t *tsd;
  arena_t *arena;
  tcaches_t tVar14;
  size_t usize;
  rtree_ctx_t *ctx;
  ulong uVar15;
  rtree_ctx_cache_elm_t *prVar16;
  rtree_ctx_cache_elm_t *prVar17;
  uintptr_t key;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  ulong alignment;
  _Bool zero;
  cache_bin_t *cache_bin;
  rtree_t *rtree;
  long *in_FS_OFFSET;
  bool bVar19;
  hook_ralloc_args_t hook_args;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_contents_t local_48;
  byte bVar18;
  
  tsd = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  _Var8 = duckdb_je_opt_zero;
  uVar10 = 0xffffffff;
  if (0xfffff < (uint)flags) {
    uVar10 = ((uint)flags >> 0x14) - 1;
  }
  bVar18 = (byte)((flags & 0x40U) >> 6);
  zero = (_Bool)(bVar18 | duckdb_je_opt_zero);
  if (uVar10 == 0xffffffff) {
    arena = (arena_t *)0x0;
LAB_0116ea3d:
    bVar19 = false;
  }
  else {
    arena = (arena_t *)duckdb_je_arenas[uVar10].repr;
    if (arena == (arena_t *)0x0) {
      arena = duckdb_je_arena_init((tsdn_t *)tsd,uVar10,&duckdb_je_arena_config_default);
    }
    if (arena != (arena_t *)0x0) goto LAB_0116ea3d;
    bVar19 = duckdb_je_narenas_auto <= uVar10;
  }
  ptVar9 = duckdb_je_tcaches;
  if (bVar19) goto LAB_0116ebef;
  uVar15 = 0xfffffffe;
  uVar10 = flags & 0xfff00;
  if (uVar10 != 0) {
    if (uVar10 == 0x100) {
      uVar15 = 0xffffffff;
    }
    else {
      uVar15 = (ulong)((uVar10 >> 8) - 2);
    }
  }
  if ((int)uVar15 == -1) {
    tcache.tcache = (tcache_t *)0x0;
  }
  else if ((int)uVar15 == -2) {
    tcache.tcache = (tcache_t *)0x0;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
      tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    }
  }
  else {
    if (duckdb_je_tcaches[uVar15].field_0.tcache == (tcache_t *)0x0) {
      duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
      abort();
    }
    if (duckdb_je_tcaches[uVar15].field_0.tcache == (tcache_t *)&DAT_00000001) {
      tVar14.field_0 =
           (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcache_create_explicit(tsd);
      ptVar9[uVar15].field_0 = tVar14.field_0;
    }
    tcache.tcache = ptVar9[uVar15].field_0.tcache;
  }
  if (tsd == (tsd_t *)0x0) {
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  alignment = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
  prVar11 = (rtree_leaf_elm_t *)((ulong)ptr & 0xffffffffc0000000);
  uVar15 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar15);
  prVar3 = *(rtree_leaf_elm_t **)((long)&ctx->cache[0].leafkey + uVar15);
  if (prVar3 == prVar11) {
    prVar11 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar2[1]);
  }
  else if ((rtree_leaf_elm_t *)ctx->l2_cache[0].leafkey == prVar11) {
    prVar6 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = (uintptr_t)prVar3;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar11;
    puVar2[1] = (ulong)prVar6;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    prVar16 = ctx->l2_cache + 1;
    if ((rtree_leaf_elm_t *)ctx->l2_cache[1].leafkey == prVar11) {
      uVar12 = 0;
      bVar19 = false;
    }
    else {
      uVar15 = 1;
      prVar17 = prVar16;
      do {
        uVar12 = uVar15;
        bVar19 = 6 < uVar12;
        if (uVar12 == 7) goto LAB_0116f2fa;
        prVar16 = prVar17 + 1;
        prVar1 = prVar17 + 1;
        uVar15 = uVar12 + 1;
        prVar17 = prVar16;
      } while ((rtree_leaf_elm_t *)prVar1->leafkey != prVar11);
      bVar19 = 6 < uVar12;
    }
    prVar6 = prVar16->leaf;
    prVar16->leafkey = ctx->l2_cache[uVar12].leafkey;
    prVar16->leaf = ctx->l2_cache[uVar12].leaf;
    ctx->l2_cache[uVar12].leafkey = (uintptr_t)prVar3;
    ctx->l2_cache[uVar12].leaf = (rtree_leaf_elm_t *)puVar2[1];
    *puVar2 = (ulong)prVar11;
    puVar2[1] = (ulong)prVar6;
    prVar11 = (rtree_leaf_elm_t *)
              ((long)&(prVar6->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0116f2fa:
    if (bVar19) {
      prVar11 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,
                           false);
    }
  }
  oldsize = duckdb_je_sz_index2size_tab[(ulong)(prVar11->le_bits).repr >> 0x30];
  if (alignment == 0) {
    if (size < 0x1001) {
      uVar15 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) goto LAB_0116eb79;
      uVar15 = size * 2 - 1;
      lVar7 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      uVar15 = -1L << (0x3c - ((byte)lVar7 ^ 0x3f) & 0x3f);
      uVar15 = ~uVar15 + size & uVar15;
    }
  }
  else if ((alignment < 0x1001 && size < 0x3801) && (do_rallocx_cold_1(), (extraout_RAX & 1) != 0))
  {
    uVar15 = CONCAT71(rtree_ctx_fallback.cache[0].leafkey._1_7_,
                      (undefined1)rtree_ctx_fallback.cache[0].leafkey);
  }
  else if (alignment < 0x7000000000000001) {
    uVar12 = 0x4000;
    if (0x4000 < size) {
      if (size < 0x7000000000000001) {
        uVar15 = size * 2 - 1;
        lVar7 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar7 == 0; lVar7 = lVar7 + -1) {
          }
        }
        uVar12 = -1L << (0x3c - ((byte)lVar7 ^ 0x3f) & 0x3f);
        uVar12 = ~uVar12 + size & uVar12;
      }
      else {
        uVar12 = 0;
      }
      if (uVar12 < size) goto LAB_0116eb79;
    }
    uVar15 = 0;
    if (uVar12 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar12) -
                  0x1000) {
      uVar15 = uVar12;
    }
  }
  else {
LAB_0116eb79:
    uVar15 = 0;
  }
  if (uVar15 + 0x8fffffffffffffff < 0x9000000000000000) goto LAB_0116ebef;
  hook_args.args[2] = (uintptr_t)flags;
  hook_args.args[3] = 0;
  hook_args.is_realloc = is_realloc;
  hook_args.args[0] = (uintptr_t)ptr;
  hook_args.args[1] = size;
  if ((alignment == 0) || ((alignment - 1 & (ulong)ptr) == 0)) {
    __dest = duckdb_je_arena_ralloc
                       ((tsdn_t *)tsd,arena,ptr,oldsize,size,alignment,zero,uVar15 < 0x3801,
                        tcache.tcache,&hook_args);
  }
  else {
    if ((alignment < 0x1001 && size < 0x3801) && (do_rallocx_cold_2(), (extraout_RAX_00 & 1) != 0))
    {
      usize = CONCAT71(rtree_ctx_fallback.cache[0].leafkey._1_7_,
                       (undefined1)rtree_ctx_fallback.cache[0].leafkey);
    }
    else if (alignment < 0x7000000000000001) {
      uVar12 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar12 = size * 2 - 1;
          lVar7 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar7 == 0; lVar7 = lVar7 + -1) {
            }
          }
          uVar12 = -1L << (0x3c - ((byte)lVar7 ^ 0x3f) & 0x3f);
          uVar12 = ~uVar12 + size & uVar12;
        }
        else {
          uVar12 = 0;
        }
        if (uVar12 < size) {
          usize = 0;
          goto LAB_0116ed5a;
        }
      }
      usize = 0;
      if (uVar12 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar12) -
                    0x1000) {
        usize = uVar12;
      }
    }
    else {
      usize = 0;
    }
LAB_0116ed5a:
    if (usize + 0x8fffffffffffffff < 0x9000000000000000) {
      __dest = (void *)0x0;
    }
    else {
      key = (uintptr_t)zero;
      __dest = duckdb_je_arena_palloc
                         ((tsdn_t *)tsd,arena,usize,alignment,zero,uVar15 < 0x3801,tcache.tcache);
      if (__dest == (void *)0x0) {
        __dest = (void *)0x0;
      }
      else {
        if (oldsize <= size) {
          size = oldsize;
        }
        switchD_00b1422a::default(__dest,ptr,size);
        duckdb_je_hook_invoke_alloc
                  (hook_args.is_realloc ^ hook_alloc_rallocx,__dest,(uintptr_t)__dest,hook_args.args
                  );
        duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args.is_realloc,ptr,hook_args.args);
        if (tcache.tcache == (tcache_t *)0x0) {
          arena_sdalloc_no_tcache((tsdn_t *)tsd,ptr,oldsize);
        }
        else {
          if (oldsize < 0x1001) {
            uVar10 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
          }
          else {
            uVar10 = sz_size2index_compute(oldsize);
          }
          if (uVar10 < 0x24) {
            cache_bin = (tcache.tcache)->bins + uVar10;
            ppvVar4 = cache_bin->stack_head;
            if ((tcache.tcache)->bins[uVar10].low_bits_full == (uint16_t)ppvVar4) {
              if (cache_bin->stack_head == (void **)&duckdb_je_disabled_bin) {
                duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
              }
              else {
                duckdb_je_tcache_bin_flush_small
                          (tsd,tcache.tcache,cache_bin,uVar10,
                           (uint)((tcache.tcache)->bins[uVar10].bin_info.ncached_max >>
                                 ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_0116f230:
                ppvVar4 = cache_bin->stack_head;
                if (cache_bin->low_bits_full != (uint16_t)ppvVar4) {
                  cache_bin->stack_head = ppvVar4 + -1;
                  ppvVar4[-1] = ptr;
                }
              }
            }
            else {
              cache_bin->stack_head = ppvVar4 + -1;
              ppvVar4[-1] = ptr;
            }
          }
          else {
            if (uVar10 < (tcache.tcache)->tcache_slow->tcache_nbins) {
              ppvVar4 = (tcache.tcache)->bins[uVar10].stack_head;
              if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
                cache_bin = (tcache.tcache)->bins + uVar10;
                if ((tcache.tcache)->bins[uVar10].low_bits_full == (uint16_t)ppvVar4) {
                  duckdb_je_tcache_bin_flush_large
                            (tsd,tcache.tcache,cache_bin,uVar10,
                             (uint)((tcache.tcache)->bins[uVar10].bin_info.ncached_max >>
                                   ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
                  goto LAB_0116f230;
                }
                cache_bin->stack_head = ppvVar4 + -1;
                ppvVar4[-1] = ptr;
                goto LAB_0116ee61;
              }
            }
            if (tsd == (tsd_t *)0x0) {
              rtree = (rtree_t *)&rtree_ctx_fallback;
              duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
            }
            else {
              rtree = (rtree_t *)
                      &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
            }
            rtree_read(&local_48,(tsdn_t *)tsd,rtree,(rtree_ctx_t *)ptr,key);
            duckdb_je_large_dalloc((tsdn_t *)tsd,local_48.edata);
          }
        }
      }
    }
  }
LAB_0116ee61:
  if (__dest != (void *)0x0) {
    rtree_ctx_fallback.cache[0].leafkey._0_1_ = 1;
    rtree_ctx_fallback.cache[0].leaf =
         (rtree_leaf_elm_t *)
         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
    rtree_ctx_fallback.cache[1].leafkey =
         (uintptr_t)
         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
    rtree_ctx_fallback.cache[1].leaf =
         (rtree_leaf_elm_t *)
         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
    rtree_ctx_fallback.cache[2].leafkey =
         (uintptr_t)
         &tsd->
          cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
    uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar5 + uVar15;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event -
        uVar5 <= uVar15) {
      duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
    }
    rtree_ctx_fallback.cache[0].leafkey._0_1_ = 0;
    rtree_ctx_fallback.cache[0].leaf =
         (rtree_leaf_elm_t *)
         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
    rtree_ctx_fallback.cache[1].leafkey =
         (uintptr_t)
         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
    rtree_ctx_fallback.cache[1].leaf =
         (rtree_leaf_elm_t *)
         &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
    rtree_ctx_fallback.cache[2].leafkey =
         (uintptr_t)
         &tsd->
          cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
    uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar5 + oldsize;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
        uVar5 <= oldsize) {
      duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
    }
    if (duckdb_je_opt_junk_alloc != true) {
      return __dest;
    }
    if ((uVar15 < oldsize || uVar15 - oldsize == 0) || (bVar18 != 0 || (_Var8 & 1U) != 0)) {
      return __dest;
    }
    switchD_005700f1::default((void *)(oldsize + (long)__dest),0xa5,uVar15 - oldsize);
    return __dest;
  }
LAB_0116ebef:
  if (is_realloc) {
    piVar13 = __errno_location();
    *piVar13 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

static void *
do_rallocx(void *ptr, size_t size, int flags, bool is_realloc) {
	void *p;
	tsd_t *tsd;
	size_t usize;
	size_t old_usize;
	size_t alignment = MALLOCX_ALIGN_GET(flags);
	arena_t *arena;

	assert(ptr != NULL);
	assert(size != 0);
	assert(malloc_initialized() || IS_INITIALIZER);
	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	unsigned arena_ind = mallocx_arena_get(flags);
	if (arena_get_from_ind(tsd, arena_ind, &arena)) {
		goto label_oom;
	}

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind,
	    /* slow */ true, /* is_alloc */ true);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
	    &alloc_ctx);
	assert(alloc_ctx.szind != SC_NSIZES);
	old_usize = sz_index2size(alloc_ctx.szind);
	assert(old_usize == isalloc(tsd_tsdn(tsd), ptr));
	if (aligned_usize_get(size, alignment, &usize, NULL, false)) {
		goto label_oom;
	}

	hook_ralloc_args_t hook_args = {is_realloc, {(uintptr_t)ptr, size,
		flags, 0}};
	if (config_prof && opt_prof) {
		p = irallocx_prof(tsd, ptr, old_usize, size, alignment, usize,
		    zero, tcache, arena, &alloc_ctx, &hook_args);
		if (unlikely(p == NULL)) {
			goto label_oom;
		}
	} else {
		p = iralloct(tsd_tsdn(tsd), ptr, old_usize, size, alignment,
		    usize, zero, tcache, arena, &hook_args);
		if (unlikely(p == NULL)) {
			goto label_oom;
		}
		assert(usize == isalloc(tsd_tsdn(tsd), p));
	}
	assert(alignment == 0 || ((uintptr_t)p & (alignment - 1)) == ZU(0));
	thread_alloc_event(tsd, usize);
	thread_dalloc_event(tsd, old_usize);

	UTRACE(ptr, size, p);
	check_entry_exit_locking(tsd_tsdn(tsd));

	if (config_fill && unlikely(opt_junk_alloc) && usize > old_usize
	    && !zero) {
		size_t excess_len = usize - old_usize;
		void *excess_start = (void *)((byte_t *)p + old_usize);
		junk_alloc_callback(excess_start, excess_len);
	}

	return p;
label_oom:
	if (is_realloc) {
		set_errno(ENOMEM);
	}
	if (config_xmalloc && unlikely(opt_xmalloc)) {
		malloc_write("<jemalloc>: Error in rallocx(): out of memory\n");
		abort();
	}
	UTRACE(ptr, size, 0);
	check_entry_exit_locking(tsd_tsdn(tsd));

	return NULL;
}